

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O1

void __thiscall
Assimp::DXFImporter::ParsePolyLineVertex(DXFImporter *this,LineReader *reader,PolyLine *line)

{
  pointer *ppuVar1;
  pointer *ppaVar2;
  pointer *ppaVar3;
  size_t __n;
  iterator iVar4;
  iterator __position;
  pointer puVar5;
  iterator __position_00;
  int iVar6;
  byte *pbVar7;
  Logger *pLVar8;
  uint uVar9;
  ulong in_RCX;
  char cVar10;
  char cVar11;
  char *pcVar12;
  ulong uVar13;
  bool bVar14;
  uint cnti;
  aiVector3D out;
  aiColor4D clr;
  uint indices [4];
  float local_6c;
  uint local_68;
  aiVector3t<float> local_64;
  aiColor4D local_58;
  int aiStack_48 [6];
  
  cVar11 = '\0';
  local_68 = 0;
  local_64.x = 0.0;
  local_64.y = 0.0;
  local_64.z = 0.0;
  local_58 = AI_DXF_DEFAULT_COLOR;
  bVar14 = true;
  if (reader->end < 2) {
    do {
      iVar6 = reader->groupcode;
      if (iVar6 < 0x3e) {
        bVar14 = SUB81(in_RCX,0);
        if (iVar6 < 0x14) {
          if (iVar6 == 8) {
            __n = (reader->value)._M_string_length;
            if ((__n != (line->layer)._M_string_length) ||
               ((__n != 0 &&
                (iVar6 = bcmp((reader->value)._M_dataplus._M_p,(line->layer)._M_dataplus._M_p,__n),
                iVar6 != 0)))) {
              pLVar8 = DefaultLogger::get();
              pcVar12 = 
              "DXF: expected vertex to be part of a poly-face but the 0x128 flag isn\'t set";
              goto LAB_00419d32;
            }
          }
          else if (iVar6 == 10) {
            local_6c = 0.0;
            fast_atoreal_move<float>
                      ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_6c,(float *)0x1,
                       bVar14);
            local_64.x = local_6c;
          }
          else if (iVar6 == 0) break;
        }
        else if (iVar6 == 0x14) {
          local_6c = 0.0;
          fast_atoreal_move<float>
                    ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_6c,(float *)0x1,
                     bVar14);
          local_64.y = local_6c;
        }
        else if (iVar6 == 0x1e) {
          local_6c = 0.0;
          fast_atoreal_move<float>
                    ((Assimp *)(reader->value)._M_dataplus._M_p,(char *)&local_6c,(float *)0x1,
                     bVar14);
          local_64.z = local_6c;
        }
      }
      else {
        in_RCX = (ulong)(iVar6 - 0x47U);
        if (iVar6 - 0x47U < 4) {
          uVar13 = (ulong)local_68;
          if (uVar13 == 4) {
            pLVar8 = DefaultLogger::get();
            pcVar12 = "DXF: more than 4 indices per face not supported; ignoring";
LAB_00419d32:
            Logger::warn(pLVar8,pcVar12);
          }
          else {
            pcVar12 = (reader->value)._M_dataplus._M_p;
            cVar10 = *pcVar12;
            iVar6 = 0;
            if (0xf5 < (byte)(cVar10 - 0x3aU)) {
              iVar6 = 0;
              do {
                pcVar12 = pcVar12 + 1;
                iVar6 = (uint)(byte)(cVar10 - 0x30) + iVar6 * 10;
                cVar10 = *pcVar12;
              } while (0xf5 < (byte)(cVar10 - 0x3aU));
            }
            local_68 = local_68 + 1;
            in_RCX = (ulong)local_68;
            aiStack_48[uVar13] = iVar6;
          }
        }
        else if (iVar6 == 0x3e) {
          pcVar12 = (reader->value)._M_dataplus._M_p;
          cVar10 = *pcVar12;
          if ((byte)(cVar10 - 0x3aU) < 0xf6) {
            uVar9 = 0;
          }
          else {
            uVar9 = 0;
            do {
              pcVar12 = pcVar12 + 1;
              uVar9 = (uint)(byte)(cVar10 - 0x30) + uVar9 * 10;
              cVar10 = *pcVar12;
            } while (0xf5 < (byte)(cVar10 - 0x3aU));
            uVar9 = uVar9 & 0xf;
          }
          in_RCX = (ulong)(uVar9 << 4);
          local_58 = *(aiColor4D *)((long)&g_aclrDxfIndexColors[0].r + in_RCX);
        }
        else if (iVar6 == 0x46) {
          pbVar7 = (byte *)(reader->value)._M_dataplus._M_p;
          in_RCX = (ulong)*pbVar7;
          cVar11 = '\0';
          if (0xf5 < (byte)(*pbVar7 - 0x3a)) {
            cVar11 = '\0';
            do {
              pbVar7 = pbVar7 + 1;
              cVar11 = (char)in_RCX + -0x30 + cVar11 * '\n';
              in_RCX = (ulong)*pbVar7;
            } while (0xf5 < (byte)(*pbVar7 - 0x3a));
          }
        }
      }
      DXF::LineReader::operator++(reader);
    } while (reader->end < 2);
    bVar14 = -1 < cVar11;
  }
  if (((line->flags & 0x40) != 0) && (bVar14)) {
    pLVar8 = DefaultLogger::get();
    Logger::warn(pLVar8,
                 "DXF: expected vertex to be part of a polyface but the 0x128 flag isn\'t set");
  }
  if (local_68 == 0) {
    __position._M_current =
         (line->positions).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (line->positions).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)line,__position,
                 &local_64);
    }
    else {
      (__position._M_current)->z = local_64.z;
      (__position._M_current)->x = local_64.x;
      (__position._M_current)->y = local_64.y;
      ppaVar2 = &(line->positions).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar2 = *ppaVar2 + 1;
    }
    __position_00._M_current =
         (line->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (line->colors).super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
      _M_realloc_insert<aiColor4t<float>const&>
                ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)&line->colors,
                 __position_00,&local_58);
    }
    else {
      (__position_00._M_current)->r = local_58.r;
      (__position_00._M_current)->g = local_58.g;
      (__position_00._M_current)->b = local_58.b;
      (__position_00._M_current)->a = local_58.a;
      ppaVar3 = &(line->colors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppaVar3 = *ppaVar3 + 1;
    }
  }
  else {
    iVar4._M_current =
         (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&line->counts,iVar4,&local_68)
      ;
    }
    else {
      *iVar4._M_current = local_68;
      ppuVar1 = &(line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    if (local_68 != 0) {
      uVar13 = 0;
      do {
        if (aiStack_48[uVar13] == 0) {
          pLVar8 = DefaultLogger::get();
          Logger::warn(pLVar8,"DXF: invalid vertex index, indices are one-based.");
          puVar5 = (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -1;
          *puVar5 = *puVar5 - 1;
          puVar5 = (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (puVar5[-1] == 0) {
            (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar5 + -1;
          }
        }
        else {
          local_6c = (float)(aiStack_48[uVar13] + -1);
          iVar4._M_current =
               (line->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (line->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(&line->indices,iVar4,(uint *)&local_6c);
          }
          else {
            *iVar4._M_current = (uint)local_6c;
            ppuVar1 = &(line->indices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < local_68);
    }
  }
  return;
}

Assistant:

void DXFImporter::ParsePolyLineVertex(DXF::LineReader& reader, DXF::PolyLine& line) {
    unsigned int cnti = 0, flags = 0;
    unsigned int indices[4];

    aiVector3D out;
    aiColor4D clr = AI_DXF_DEFAULT_COLOR;

    while( !reader.End() ) {

        if (reader.Is(0)) { // SEQEND or another VERTEX
            break;
        }

        switch (reader.GroupCode()) {
        case 8:
                // layer to which the vertex belongs to - assume that
                // this is always the layer the top-level poly-line
                // entity resides on as well.
                if(reader.Value() != line.layer) {
                    ASSIMP_LOG_WARN("DXF: expected vertex to be part of a poly-face but the 0x128 flag isn't set");
                }
                break;

        case 70:
                flags = reader.ValueAsUnsignedInt();
                break;

        // VERTEX COORDINATES
        case GroupCode_XComp:
            out.x = reader.ValueAsFloat();
            break;

        case GroupCode_YComp:
            out.y = reader.ValueAsFloat();
            break;

        case GroupCode_ZComp:
            out.z = reader.ValueAsFloat();
            break;

        // POLYFACE vertex indices
        case 71:
        case 72:
        case 73:
        case 74:
            if (cnti == 4) {
                ASSIMP_LOG_WARN("DXF: more than 4 indices per face not supported; ignoring");
                break;
            }
            indices[cnti++] = reader.ValueAsUnsignedInt();
            break;

        // color
        case 62:
            clr = g_aclrDxfIndexColors[reader.ValueAsUnsignedInt() % AI_DXF_NUM_INDEX_COLORS];
            break;
        };

        reader++;
    }

    if (line.flags & DXF_POLYLINE_FLAG_POLYFACEMESH && !(flags & DXF_VERTEX_FLAG_PART_OF_POLYFACE)) {
        ASSIMP_LOG_WARN("DXF: expected vertex to be part of a polyface but the 0x128 flag isn't set");
    }

    if (cnti) {
        line.counts.push_back(cnti);
        for (unsigned int i = 0; i < cnti; ++i) {
            // IMPORTANT NOTE: POLYMESH indices are ONE-BASED
            if (indices[i] == 0) {
                ASSIMP_LOG_WARN("DXF: invalid vertex index, indices are one-based.");
                --line.counts.back();
                // Workaround to fix issue 2229
                if (line.counts.back() == 0) {
                    line.counts.pop_back();
                }
                continue;
            }
            line.indices.push_back(indices[i]-1);
        }
    } else {
        line.positions.push_back(out);
        line.colors.push_back(clr);
    }
}